

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::ValidateSymbolName
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = name->_M_string_length;
  if (uVar2 == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
    uVar4 = 1;
    do {
      bVar1 = (name->_M_dataplus)._M_p[uVar4 - 1];
      if ((bVar1 != 0x2e) && (bVar1 != 0x5f)) {
        if ((char)bVar1 < '0') {
          return bVar3;
        }
        if (0x39 < bVar1) {
          if (bVar1 < 0x41) {
            return bVar3;
          }
          if (0x5a < bVar1 && (byte)(bVar1 + 0x85) < 0xe6) {
            return bVar3;
          }
        }
      }
      bVar3 = uVar2 <= uVar4;
      bVar5 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::ValidateSymbolName(
    const string& name) {
  for (int i = 0; i < name.size(); i++) {
    // I don't trust ctype.h due to locales.  :(
    if (name[i] != '.' && name[i] != '_' &&
        (name[i] < '0' || name[i] > '9') &&
        (name[i] < 'A' || name[i] > 'Z') &&
        (name[i] < 'a' || name[i] > 'z')) {
      return false;
    }
  }
  return true;
}